

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O0

void Ivy_ManSeqFindCut(Ivy_Man_t *p,Ivy_Obj_t *pRoot,Vec_Int_t *vFront,Vec_Int_t *vInside,int nSize)

{
  int iVar1;
  int nSize_local;
  Vec_Int_t *vInside_local;
  Vec_Int_t *vFront_local;
  Ivy_Obj_t *pRoot_local;
  Ivy_Man_t *p_local;
  
  iVar1 = Ivy_IsComplement(pRoot);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCut.c"
                  ,0xb9,
                  "void Ivy_ManSeqFindCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Int_t *, Vec_Int_t *, int)")
    ;
  }
  iVar1 = Ivy_ObjIsNode(pRoot);
  if (iVar1 == 0) {
    __assert_fail("Ivy_ObjIsNode(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCut.c"
                  ,0xba,
                  "void Ivy_ManSeqFindCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Int_t *, Vec_Int_t *, int)")
    ;
  }
  iVar1 = Ivy_ObjFaninId0(pRoot);
  if (iVar1 == 0) {
    __assert_fail("Ivy_ObjFaninId0(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCut.c"
                  ,0xbb,
                  "void Ivy_ManSeqFindCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Int_t *, Vec_Int_t *, int)")
    ;
  }
  iVar1 = Ivy_ObjFaninId1(pRoot);
  if (iVar1 == 0) {
    __assert_fail("Ivy_ObjFaninId1(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCut.c"
                  ,0xbc,
                  "void Ivy_ManSeqFindCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Int_t *, Vec_Int_t *, int)")
    ;
  }
  Vec_IntClear(vFront);
  iVar1 = Ivy_ObjFaninId0(pRoot);
  iVar1 = Ivy_LeafCreate(iVar1,0);
  Vec_IntPush(vFront,iVar1);
  iVar1 = Ivy_ObjFaninId1(pRoot);
  iVar1 = Ivy_LeafCreate(iVar1,0);
  Vec_IntPush(vFront,iVar1);
  Vec_IntClear(vInside);
  iVar1 = Ivy_LeafCreate(pRoot->Id,0);
  Vec_IntPush(vInside,iVar1);
  iVar1 = Ivy_ObjFaninId0(pRoot);
  iVar1 = Ivy_LeafCreate(iVar1,0);
  Vec_IntPush(vInside,iVar1);
  iVar1 = Ivy_ObjFaninId1(pRoot);
  iVar1 = Ivy_LeafCreate(iVar1,0);
  Vec_IntPush(vInside,iVar1);
  do {
    iVar1 = Ivy_ManSeqFindCut_int(p,vFront,vInside,nSize);
  } while (iVar1 != 0);
  iVar1 = Vec_IntSize(vFront);
  if (nSize < iVar1) {
    __assert_fail("Vec_IntSize(vFront) <= nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCut.c"
                  ,0xcb,
                  "void Ivy_ManSeqFindCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Int_t *, Vec_Int_t *, int)")
    ;
  }
  return;
}

Assistant:

void Ivy_ManSeqFindCut( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Vec_Int_t * vFront, Vec_Int_t * vInside, int nSize )
{
    assert( !Ivy_IsComplement(pRoot) );
    assert( Ivy_ObjIsNode(pRoot) );
    assert( Ivy_ObjFaninId0(pRoot) );
    assert( Ivy_ObjFaninId1(pRoot) );

    // start the cut 
    Vec_IntClear( vFront );
    Vec_IntPush( vFront, Ivy_LeafCreate(Ivy_ObjFaninId0(pRoot), 0) );
    Vec_IntPush( vFront, Ivy_LeafCreate(Ivy_ObjFaninId1(pRoot), 0) );

    // start the visited nodes
    Vec_IntClear( vInside );
    Vec_IntPush( vInside, Ivy_LeafCreate(pRoot->Id, 0) );
    Vec_IntPush( vInside, Ivy_LeafCreate(Ivy_ObjFaninId0(pRoot), 0) );
    Vec_IntPush( vInside, Ivy_LeafCreate(Ivy_ObjFaninId1(pRoot), 0) );

    // compute the cut
    while ( Ivy_ManSeqFindCut_int( p, vFront, vInside, nSize ) );
    assert( Vec_IntSize(vFront) <= nSize );
}